

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

RegularExpression * TransformCompile(RegularExpression *__return_storage_ptr__,string *str)

{
  __return_storage_ptr__->regmust = (char *)0x0;
  __return_storage_ptr__->program = (char *)0x0;
  __return_storage_ptr__->progsize = 0;
  memset(__return_storage_ptr__,0,0x20a);
  cmsys::RegularExpression::compile(__return_storage_ptr__,(str->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

static cmsys::RegularExpression TransformCompile(const std::string& str)
{
  return cmsys::RegularExpression(str);
}